

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.h
# Opt level: O2

rgba_vec_t * sfc::to_rgba(rgba_vec_t *__return_storage_ptr__,channel_vec_t *data)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  runtime_error *this;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  allocator_type local_11;
  
  uVar5 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar5 & 3) == 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,uVar5 >> 2,&local_11);
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 3;
    for (uVar6 = 0; (ulong)uVar6 < (ulong)((long)puVar2 - (long)puVar1 >> 2); uVar6 = uVar6 + 1) {
      puVar1[uVar6] =
           CONCAT13(puVar3[uVar4],
                    CONCAT12(puVar3[uVar4 - 1],CONCAT11(puVar3[uVar4 - 2],puVar3[uVar4 - 3])));
      uVar4 = uVar4 + 4;
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"RGBA vector size not a multiple of 4");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline rgba_vec_t to_rgba(const channel_vec_t& data) {
  if (data.size() % 4 != 0)
    throw std::runtime_error("RGBA vector size not a multiple of 4");
  rgba_vec_t v(data.size() >> 2);
  for (unsigned i = 0; i < v.size(); ++i) {
    v[i] = (data[i * 4]) + (data[(i * 4) + 1] << 8) + (data[(i * 4) + 2] << 16) + (data[(i * 4) + 3] << 24);
  }
  return v;
}